

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

int __thiscall cmCTestScriptHandler::RunConfigurationDashboard(cmCTestScriptHandler *this)

{
  OutputOption OVar1;
  cmCTest *pcVar2;
  string_view arg;
  bool bVar3;
  __type _Var4;
  bool bVar5;
  ostream *poVar6;
  char *pcVar7;
  ulong uVar8;
  reference pbVar9;
  duration<double,_std::ratio<1L,_1L>_> timeout;
  string local_fa8 [32];
  undefined1 local_f88 [8];
  ostringstream cmCTestLog_msg_6;
  string local_e10 [32];
  undefined1 local_df0 [8];
  ostringstream cmCTestLog_msg_5;
  string local_c70 [32];
  undefined1 local_c50 [8];
  ostringstream cmCTestLog_msg_4;
  string *ctestCommand;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_aa8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ctestCommands;
  undefined1 local_a70 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_8f8 [8];
  cmGeneratedFileStream fout;
  undefined1 local_670 [8];
  ostringstream cmCTestLog_msg_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  undefined1 local_4b8 [8];
  string cmakeOutputFile;
  string local_490 [32];
  undefined1 local_470 [8];
  ostringstream cmCTestLog_msg_1;
  cmAlphaNum local_2f8;
  cmAlphaNum local_2c8;
  string local_298;
  string local_278 [8];
  string cmakeFailedOuput;
  int cmakeFailed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  Status local_210;
  string local_208 [32];
  undefined1 local_1e8 [8];
  ostringstream cmCTestLog_msg;
  uint local_5c;
  undefined1 local_58 [3];
  bool res;
  int retVal;
  string output;
  string command;
  cmCTestScriptHandler *this_local;
  
  std::__cxx11::string::string((string *)(output.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_58);
  local_5c = CheckOutSourceDir(this);
  this_local._4_4_ = local_5c;
  if ((local_5c != 0) ||
     (local_5c = BackupDirectories(this), this_local._4_4_ = local_5c, local_5c != 0))
  goto LAB_009f3c30;
  if (((this->EmptyBinDir & 1U) != 0) && (bVar3 = EmptyBinaryDirectory(&this->BinaryDir), !bVar3)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    poVar6 = std::operator<<((ostream *)local_1e8,"Problem removing the binary directory");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0x2a6,pcVar7,false);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  }
  bVar3 = cmsys::SystemTools::FileExists(&this->BinaryDir);
  if ((!bVar3) && (bVar3 = std::operator!=(&this->SourceDir,&this->BinaryDir), bVar3)) {
    local_210 = cmsys::SystemTools::MakeDirectory(&this->BinaryDir,(mode_t *)0x0);
    bVar3 = cmsys::Status::operator_cast_to_bool(&local_210);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      std::operator+(&local_230,"Unable to create the binary directory:\n",&this->BinaryDir);
      cmSystemTools::Error(&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      RestoreBackupDirectories(this);
      this_local._4_4_ = 7;
      goto LAB_009f3c30;
    }
  }
  if (((this->EmptyBinDir & 1U) != 0) &&
     (_Var4 = std::operator==(&this->SourceDir,&this->BinaryDir), _Var4)) {
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmakeFailed,
                 "You have specified the source and binary directories to be the same (an in source build). You have also specified that the binary directory is to be erased. This means that the source will have to be checked out from CVS. But you have not specified CTEST_CVS_CHECKOUT"
                 ,(allocator<char> *)(cmakeFailedOuput.field_2._M_local_buf + 0xf));
      cmSystemTools::Error((string *)&cmakeFailed);
      std::__cxx11::string::~string((string *)&cmakeFailed);
      std::allocator<char>::~allocator
                ((allocator<char> *)(cmakeFailedOuput.field_2._M_local_buf + 0xf));
      this_local._4_4_ = 8;
      goto LAB_009f3c30;
    }
    local_5c = CheckOutSourceDir(this);
    if (local_5c != 0) {
      RestoreBackupDirectories(this);
      this_local._4_4_ = local_5c;
      goto LAB_009f3c30;
    }
    local_5c = 0;
  }
  local_5c = PerformExtraUpdates(this);
  this_local._4_4_ = local_5c;
  if (local_5c == 0) {
    uVar8 = std::__cxx11::string::empty();
    if (((uVar8 & 1) != 0) ||
       (bVar3 = WriteInitialCache(&this->BinaryDir,&this->InitialCache), bVar3)) {
      cmakeFailedOuput.field_2._8_4_ = 0;
      std::__cxx11::string::string(local_278);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        cmAlphaNum::cmAlphaNum(&local_2c8,&this->CMakeCmd);
        cmAlphaNum::cmAlphaNum(&local_2f8," \"");
        cmStrCat<std::__cxx11::string>(&local_298,&local_2c8,&local_2f8,&this->SourceDir);
        std::__cxx11::string::operator=
                  ((string *)(output.field_2._M_local_buf + 8),(string *)&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::clear();
        std::__cxx11::string::operator+=((string *)(output.field_2._M_local_buf + 8),"\"");
        local_5c = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
        poVar6 = std::operator<<((ostream *)local_470,"Run cmake command: ");
        poVar6 = std::operator<<(poVar6,(string *)(output.field_2._M_local_buf + 8));
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                     ,0x2e4,pcVar7,false);
        std::__cxx11::string::~string(local_490);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        OVar1 = (this->super_cmCTestGenericHandler).HandlerVerbose;
        cmakeOutputFile.field_2._8_8_ = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
        bVar3 = cmSystemTools::RunSingleCommand
                          ((string *)((long)&output.field_2 + 8),(string *)local_58,
                           (string *)local_58,(int *)&local_5c,pcVar7,OVar1,
                           (cmDuration)cmakeOutputFile.field_2._8_8_);
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          std::__cxx11::string::string((string *)local_4b8,(string *)&this->CMOutFile);
          bVar5 = cmsys::SystemTools::FileIsFullPath((string *)local_4b8);
          if (!bVar5) {
            std::operator+(&local_4f8,&this->BinaryDir,"/");
            std::operator+(&local_4d8,&local_4f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4b8);
            std::__cxx11::string::operator=((string *)local_4b8,(string *)&local_4d8);
            std::__cxx11::string::~string((string *)&local_4d8);
            std::__cxx11::string::~string((string *)&local_4f8);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
          poVar6 = std::operator<<((ostream *)local_670,"Write CMake output to file: ");
          poVar6 = std::operator<<(poVar6,(string *)local_4b8);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                       ,0x2f1,pcVar7,false);
          std::__cxx11::string::~string((string *)&fout.field_0x260);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)local_8f8,(string *)local_4b8,false,None);
          bVar5 = std::ios::operator_cast_to_bool
                            ((ios *)(local_8f8 + (long)*(_func_int **)((long)local_8f8 + -0x18)));
          if (bVar5) {
            pcVar7 = (char *)std::__cxx11::string::c_str();
            std::operator<<((ostream *)local_8f8,pcVar7);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a70);
            poVar6 = std::operator<<((ostream *)local_a70,"Cannot open CMake output file: ");
            poVar6 = std::operator<<(poVar6,(string *)local_4b8);
            poVar6 = std::operator<<(poVar6," for writing");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar2,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                         ,0x2f8,pcVar7,false);
            std::__cxx11::string::~string
                      ((string *)
                       &ctestCommands.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a70);
          }
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_8f8);
          std::__cxx11::string::~string((string *)local_4b8);
        }
        if ((!bVar3) || (local_5c != 0)) {
          cmakeFailedOuput.field_2._8_4_ = 1;
          std::__cxx11::string::operator=(local_278,(string *)local_58);
        }
      }
      arg = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->CTestCmd);
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_aa8,arg,false);
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_aa8);
      ctestCommand = (string *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_aa8);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&ctestCommand), bVar3) {
        pbVar9 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
        std::__cxx11::string::operator=
                  ((string *)(output.field_2._M_local_buf + 8),(string *)pbVar9);
        std::__cxx11::string::clear();
        local_5c = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c50);
        poVar6 = std::operator<<((ostream *)local_c50,"Run ctest command: ");
        poVar6 = std::operator<<(poVar6,(string *)(output.field_2._M_local_buf + 8));
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                     ,0x30a,pcVar7,false);
        std::__cxx11::string::~string(local_c70);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c50);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        OVar1 = (this->super_cmCTestGenericHandler).HandlerVerbose;
        timeout = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
        bVar3 = cmSystemTools::RunSingleCommand
                          ((string *)((long)&output.field_2 + 8),(string *)local_58,
                           (string *)local_58,(int *)&local_5c,pcVar7,OVar1,(cmDuration)timeout.__r)
        ;
        if (((!bVar3) || (cmakeFailedOuput.field_2._8_4_ != 0)) || ((local_5c & 4) != 0)) {
          RestoreBackupDirectories(this);
          if (cmakeFailedOuput.field_2._8_4_ == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f88);
            poVar6 = std::operator<<((ostream *)local_f88,"Unable to run ctest:");
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<(poVar6,"command: ");
            poVar6 = std::operator<<(poVar6,(string *)(output.field_2._M_local_buf + 8));
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<(poVar6,"output: ");
            poVar6 = std::operator<<(poVar6,(string *)local_58);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar2,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                         ,0x31b,pcVar7,false);
            std::__cxx11::string::~string(local_fa8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f88);
            if (bVar3) {
              this_local._4_4_ = local_5c * 100;
            }
            else {
              this_local._4_4_ = 0xb;
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_df0);
            poVar6 = std::operator<<((ostream *)local_df0,"Unable to run cmake:");
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<(poVar6,local_278);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar2,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                         ,0x315,pcVar7,false);
            std::__cxx11::string::~string(local_e10);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_df0);
            this_local._4_4_ = 10;
          }
          goto LAB_009f3bfc;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      if ((this->Backup & 1U) != 0) {
        cmsys::SystemTools::RemoveADirectory(&this->BackupSourceDir);
        cmsys::SystemTools::RemoveADirectory(&this->BackupBinaryDir);
      }
      this_local._4_4_ = 0;
LAB_009f3bfc:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_aa8);
      std::__cxx11::string::~string(local_278);
    }
    else {
      RestoreBackupDirectories(this);
      this_local._4_4_ = 9;
    }
  }
LAB_009f3c30:
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
  return this_local._4_4_;
}

Assistant:

int cmCTestScriptHandler::RunConfigurationDashboard()
{
  // local variables
  std::string command;
  std::string output;
  int retVal;
  bool res;

  // make sure the src directory is there, if it isn't then we might be able
  // to check it out from cvs
  retVal = this->CheckOutSourceDir();
  if (retVal) {
    return retVal;
  }

  // backup the dirs if requested
  retVal = this->BackupDirectories();
  if (retVal) {
    return retVal;
  }

  // clear the binary directory?
  if (this->EmptyBinDir) {
    if (!cmCTestScriptHandler::EmptyBinaryDirectory(this->BinaryDir)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Problem removing the binary directory" << std::endl);
    }
  }

  // make sure the binary directory exists if it isn't the srcdir
  if (!cmSystemTools::FileExists(this->BinaryDir) &&
      this->SourceDir != this->BinaryDir) {
    if (!cmSystemTools::MakeDirectory(this->BinaryDir)) {
      cmSystemTools::Error("Unable to create the binary directory:\n" +
                           this->BinaryDir);
      this->RestoreBackupDirectories();
      return 7;
    }
  }

  // if the binary directory and the source directory are the same,
  // and we are starting with an empty binary directory, then that means
  // we must check out the source tree
  if (this->EmptyBinDir && this->SourceDir == this->BinaryDir) {
    // make sure we have the required info
    if (this->CVSCheckOut.empty()) {
      cmSystemTools::Error(
        "You have specified the source and binary "
        "directories to be the same (an in source build). You have also "
        "specified that the binary directory is to be erased. This means "
        "that the source will have to be checked out from CVS. But you have "
        "not specified CTEST_CVS_CHECKOUT");
      return 8;
    }

    // we must now checkout the src dir
    retVal = this->CheckOutSourceDir();
    if (retVal) {
      this->RestoreBackupDirectories();
      return retVal;
    }
  }

  // backup the dirs if requested
  retVal = this->PerformExtraUpdates();
  if (retVal) {
    return retVal;
  }

  // put the initial cache into the bin dir
  if (!this->InitialCache.empty()) {
    if (!cmCTestScriptHandler::WriteInitialCache(this->BinaryDir,
                                                 this->InitialCache)) {
      this->RestoreBackupDirectories();
      return 9;
    }
  }

  // do an initial cmake to setup the DartConfig file
  int cmakeFailed = 0;
  std::string cmakeFailedOuput;
  if (!this->CMakeCmd.empty()) {
    command = cmStrCat(this->CMakeCmd, " \"", this->SourceDir);
    output.clear();
    command += "\"";
    retVal = 0;
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Run cmake command: " << command << std::endl);
    res = cmSystemTools::RunSingleCommand(
      command, &output, &output, &retVal, this->BinaryDir.c_str(),
      this->HandlerVerbose, cmDuration::zero() /*this->TimeOut*/);

    if (!this->CMOutFile.empty()) {
      std::string cmakeOutputFile = this->CMOutFile;
      if (!cmSystemTools::FileIsFullPath(cmakeOutputFile)) {
        cmakeOutputFile = this->BinaryDir + "/" + cmakeOutputFile;
      }

      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 "Write CMake output to file: " << cmakeOutputFile
                                                << std::endl);
      cmGeneratedFileStream fout(cmakeOutputFile);
      if (fout) {
        fout << output.c_str();
      } else {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Cannot open CMake output file: "
                     << cmakeOutputFile << " for writing" << std::endl);
      }
    }
    if (!res || retVal != 0) {
      // even if this fails continue to the next step
      cmakeFailed = 1;
      cmakeFailedOuput = output;
    }
  }

  // run ctest, it may be more than one command in here
  std::vector<std::string> ctestCommands = cmExpandedList(this->CTestCmd);
  // for each variable/argument do a putenv
  for (std::string const& ctestCommand : ctestCommands) {
    command = ctestCommand;
    output.clear();
    retVal = 0;
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Run ctest command: " << command << std::endl);
    res = cmSystemTools::RunSingleCommand(
      command, &output, &output, &retVal, this->BinaryDir.c_str(),
      this->HandlerVerbose, cmDuration::zero() /*this->TimeOut*/);

    // did something critical fail in ctest
    if (!res || cmakeFailed || retVal & cmCTest::BUILD_ERRORS) {
      this->RestoreBackupDirectories();
      if (cmakeFailed) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Unable to run cmake:" << std::endl
                                          << cmakeFailedOuput << std::endl);
        return 10;
      }
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to run ctest:" << std::endl
                                        << "command: " << command << std::endl
                                        << "output: " << output << std::endl);
      if (!res) {
        return 11;
      }
      return retVal * 100;
    }
  }

  // if all was successful, delete the backup dirs to free up disk space
  if (this->Backup) {
    cmSystemTools::RemoveADirectory(this->BackupSourceDir);
    cmSystemTools::RemoveADirectory(this->BackupBinaryDir);
  }

  return 0;
}